

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.c
# Opt level: O1

uint8_t av1_findSamples(AV1_COMMON *cm,MACROBLOCKD *xd,int *pts,int *pts_inref)

{
  char cVar1;
  _Bool _Var2;
  _Bool _Var3;
  BLOCK_SIZE BVar4;
  byte bVar5;
  uint uVar6;
  int mi_row;
  int mi_col;
  MB_MODE_INFO **ppMVar7;
  MB_MODE_INFO *pMVar8;
  bool bVar9;
  uint uVar10;
  uint uVar11;
  byte bVar12;
  int iVar14;
  uint uVar15;
  int iVar16;
  byte bVar17;
  byte bVar18;
  bool bVar19;
  bool bVar20;
  uint uVar13;
  
  ppMVar7 = xd->mi;
  cVar1 = (*ppMVar7)->ref_frame[0];
  _Var2 = xd->up_available;
  _Var3 = xd->left_available;
  uVar6 = xd->mi_stride;
  mi_row = xd->mi_row;
  mi_col = xd->mi_col;
  if (_Var2 == true) {
    pMVar8 = ppMVar7[-(long)(int)uVar6];
    BVar4 = pMVar8->bsize;
    bVar17 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[BVar4];
    bVar18 = xd->width;
    if (bVar17 < bVar18) {
      uVar11 = 0;
      iVar16 = (cm->mi_params).mi_cols;
      bVar19 = iVar16 <= mi_col;
      uVar15 = uVar11;
      if (mi_col < iVar16) {
        uVar13 = 0;
        do {
          pMVar8 = ppMVar7[(int)(uVar11 - uVar6)];
          BVar4 = pMVar8->bsize;
          bVar17 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                   [BVar4];
          if ((pMVar8->ref_frame[0] == cVar1) && (pMVar8->ref_frame[1] == -1)) {
            bVar12 = block_size_wide[BVar4];
            bVar5 = block_size_high[BVar4];
            *pts = uVar11 * 0x20 + -8 + (bVar12 & 0xfe) * 4;
            pts[1] = (~(uint)bVar5 & 0x3ffffffe) << 2;
            *pts_inref = (int)pMVar8->mv[0].as_mv.col + uVar11 * 0x20 + (bVar12 & 0xfe) * 4 + -8;
            pts_inref[1] = (int)pMVar8->mv[0].as_mv.row + pts[1];
            pts = pts + 2;
            pts_inref = pts_inref + 2;
            bVar12 = (char)uVar13 + 1;
            uVar13 = (uint)bVar12;
            uVar15 = (uint)bVar12;
            if (7 < bVar12) break;
          }
          uVar11 = uVar11 + bVar17;
          uVar10 = (cm->mi_params).mi_cols - mi_col;
          if ((int)(uint)bVar18 <= (int)uVar10) {
            uVar10 = (uint)bVar18;
          }
          bVar19 = (int)uVar10 <= (int)uVar11;
          uVar15 = uVar13;
        } while ((int)uVar11 < (int)uVar10);
      }
      bVar20 = true;
      bVar9 = true;
    }
    else {
      iVar16 = mi_col % (int)(uint)bVar17;
      bVar20 = iVar16 < 1;
      bVar9 = (int)((uint)bVar17 - iVar16) <= (int)(uint)bVar18;
      bVar19 = true;
      if ((pMVar8->ref_frame[0] == cVar1) && (pMVar8->ref_frame[1] == -1)) {
        bVar17 = block_size_high[BVar4];
        iVar16 = (block_size_wide[BVar4] & 0xfe) * 4 + iVar16 * -0x20;
        *pts = iVar16 + -8;
        pts[1] = (~(uint)bVar17 & 0x3ffffffe) << 2;
        *pts_inref = iVar16 + pMVar8->mv[0].as_mv.col + -8;
        pts_inref[1] = (int)pMVar8->mv[0].as_mv.row + pts[1];
        pts = pts + 2;
        pts_inref = pts_inref + 2;
        uVar15 = 1;
      }
      else {
        uVar15 = 0;
      }
    }
    if (!bVar19) {
      return '\b';
    }
  }
  else {
    bVar9 = true;
    uVar15 = 0;
    bVar20 = true;
  }
  bVar17 = (byte)uVar15;
  if (_Var3 == false) goto LAB_00397e5d;
  pMVar8 = ppMVar7[-1];
  BVar4 = pMVar8->bsize;
  bVar18 = xd->height;
  if ("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[BVar4] < bVar18)
  {
    iVar16 = (cm->mi_params).mi_rows;
    bVar19 = mi_row < iVar16;
    if (mi_row < iVar16) {
      iVar16 = 0;
      do {
        pMVar8 = ppMVar7[(long)(int)(iVar16 * uVar6) + -1];
        BVar4 = pMVar8->bsize;
        bVar12 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[BVar4]
        ;
        if ((pMVar8->ref_frame[0] == cVar1) && (pMVar8->ref_frame[1] == -1)) {
          bVar17 = block_size_high[BVar4];
          iVar14 = (~(uint)block_size_wide[BVar4] & 0x3ffffffe) * 4;
          *pts = iVar14;
          pts[1] = iVar16 * 0x20 + (bVar17 & 0xfe) * 4 + -8;
          *pts_inref = pMVar8->mv[0].as_mv.col + iVar14;
          pts_inref[1] = (int)pMVar8->mv[0].as_mv.row + pts[1];
          pts = pts + 2;
          pts_inref = pts_inref + 2;
          bVar17 = (char)uVar15 + 1;
          uVar15 = (uint)bVar17;
          if (7 < bVar17) break;
        }
        bVar17 = (byte)uVar15;
        iVar16 = iVar16 + (uint)bVar12;
        uVar11 = (cm->mi_params).mi_rows - mi_row;
        if ((int)(uint)bVar18 <= (int)uVar11) {
          uVar11 = (uint)bVar18;
        }
        bVar19 = iVar16 < (int)uVar11;
      } while (iVar16 < (int)uVar11);
    }
    if (bVar19) {
      bVar19 = false;
    }
    else {
LAB_00397e48:
      bVar19 = true;
    }
  }
  else {
    iVar16 = mi_row % (int)(uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                                 [BVar4];
    if (0 < iVar16) {
      bVar20 = false;
    }
    bVar19 = true;
    if ((pMVar8->ref_frame[0] == cVar1) && (pMVar8->ref_frame[1] == -1)) {
      bVar18 = block_size_high[BVar4];
      iVar14 = (~(uint)block_size_wide[BVar4] & 0x3ffffffe) * 4;
      *pts = iVar14;
      pts[1] = (bVar18 & 0xfe) * 4 + iVar16 * -0x20 + -8;
      *pts_inref = pMVar8->mv[0].as_mv.col + iVar14;
      pts_inref[1] = (int)pMVar8->mv[0].as_mv.row + pts[1];
      pts = pts + 2;
      pts_inref = pts_inref + 2;
      bVar17 = bVar17 + 1;
      bVar19 = bVar17 < 8;
    }
    if (bVar19) goto LAB_00397e48;
    bVar19 = false;
  }
  if (!bVar19) {
    return '\b';
  }
LAB_00397e5d:
  if ((bVar20 & _Var3 & _Var2) == 1) {
    pMVar8 = ppMVar7[(int)~uVar6];
    bVar20 = true;
    if ((pMVar8->ref_frame[0] == cVar1) && (pMVar8->ref_frame[1] == -1)) {
      bVar18 = block_size_high[pMVar8->bsize];
      iVar16 = (~(uint)block_size_wide[pMVar8->bsize] & 0x3ffffffe) * 4;
      *pts = iVar16;
      pts[1] = (~(uint)bVar18 & 0x3ffffffe) << 2;
      *pts_inref = pMVar8->mv[0].as_mv.col + iVar16;
      pts_inref[1] = (int)pMVar8->mv[0].as_mv.row + pts[1];
      pts = pts + 2;
      pts_inref = pts_inref + 2;
      bVar17 = bVar17 + 1;
      bVar20 = bVar17 < 8;
    }
    if (!bVar20) {
      return '\b';
    }
  }
  if (bVar9) {
    bVar18 = xd->width;
    bVar12 = xd->height;
    if (xd->height < bVar18) {
      bVar12 = bVar18;
    }
    iVar16 = has_top_right(cm,xd,mi_row,mi_col,(uint)bVar12);
    if ((iVar16 != 0) && ((xd->tile).mi_row_start < mi_row)) {
      uVar15 = (uint)bVar18;
      if ((((xd->tile).mi_col_start <= (int)(mi_col + uVar15)) &&
          (((mi_row <= (xd->tile).mi_row_end && ((int)(mi_col + uVar15) < (xd->tile).mi_col_end)) &&
           (pMVar8 = ppMVar7[(int)(uVar15 - uVar6)], pMVar8->ref_frame[0] == cVar1)))) &&
         (pMVar8->ref_frame[1] == -1)) {
        bVar18 = block_size_wide[pMVar8->bsize];
        bVar12 = block_size_high[pMVar8->bsize];
        *pts = uVar15 * 0x20 + (bVar18 & 0xfe) * 4 + -8;
        pts[1] = (~(uint)bVar12 & 0x3ffffffe) << 2;
        *pts_inref = (int)pMVar8->mv[0].as_mv.col + uVar15 * 0x20 + (bVar18 & 0xfe) * 4 + -8;
        pts_inref[1] = (int)pMVar8->mv[0].as_mv.row + pts[1];
        bVar18 = bVar17 + 1;
        bVar17 = 8;
        if (bVar18 < 8) {
          bVar17 = bVar18;
        }
      }
    }
  }
  return bVar17;
}

Assistant:

uint8_t av1_findSamples(const AV1_COMMON *cm, MACROBLOCKD *xd, int *pts,
                        int *pts_inref) {
  const MB_MODE_INFO *const mbmi0 = xd->mi[0];
  const int ref_frame = mbmi0->ref_frame[0];
  const int up_available = xd->up_available;
  const int left_available = xd->left_available;
  uint8_t np = 0;
  int do_tl = 1;
  int do_tr = 1;
  const int mi_stride = xd->mi_stride;
  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;

  // scan the nearest above rows
  if (up_available) {
    const int mi_row_offset = -1;
    const MB_MODE_INFO *mbmi = xd->mi[mi_row_offset * mi_stride];
    uint8_t superblock_width = mi_size_wide[mbmi->bsize];

    if (xd->width <= superblock_width) {
      // Handle "current block width <= above block width" case.
      const int col_offset = -mi_col % superblock_width;

      if (col_offset < 0) do_tl = 0;
      if (col_offset + superblock_width > xd->width) do_tr = 0;

      if (mbmi->ref_frame[0] == ref_frame && mbmi->ref_frame[1] == NONE_FRAME) {
        record_samples(mbmi, pts, pts_inref, 0, -1, col_offset, 1);
        pts += 2;
        pts_inref += 2;
        if (++np >= LEAST_SQUARES_SAMPLES_MAX) return LEAST_SQUARES_SAMPLES_MAX;
      }
    } else {
      // Handle "current block width > above block width" case.
      for (int i = 0; i < AOMMIN(xd->width, cm->mi_params.mi_cols - mi_col);
           i += superblock_width) {
        mbmi = xd->mi[i + mi_row_offset * mi_stride];
        superblock_width = mi_size_wide[mbmi->bsize];

        if (mbmi->ref_frame[0] == ref_frame &&
            mbmi->ref_frame[1] == NONE_FRAME) {
          record_samples(mbmi, pts, pts_inref, 0, -1, i, 1);
          pts += 2;
          pts_inref += 2;
          if (++np >= LEAST_SQUARES_SAMPLES_MAX)
            return LEAST_SQUARES_SAMPLES_MAX;
        }
      }
    }
  }
  assert(np <= LEAST_SQUARES_SAMPLES_MAX);

  // scan the nearest left columns
  if (left_available) {
    const int mi_col_offset = -1;
    const MB_MODE_INFO *mbmi = xd->mi[mi_col_offset];
    uint8_t superblock_height = mi_size_high[mbmi->bsize];

    if (xd->height <= superblock_height) {
      // Handle "current block height <= above block height" case.
      const int row_offset = -mi_row % superblock_height;

      if (row_offset < 0) do_tl = 0;

      if (mbmi->ref_frame[0] == ref_frame && mbmi->ref_frame[1] == NONE_FRAME) {
        record_samples(mbmi, pts, pts_inref, row_offset, 1, 0, -1);
        pts += 2;
        pts_inref += 2;
        np++;
        if (np >= LEAST_SQUARES_SAMPLES_MAX) return LEAST_SQUARES_SAMPLES_MAX;
      }
    } else {
      // Handle "current block height > above block height" case.
      for (int i = 0; i < AOMMIN(xd->height, cm->mi_params.mi_rows - mi_row);
           i += superblock_height) {
        mbmi = xd->mi[mi_col_offset + i * mi_stride];
        superblock_height = mi_size_high[mbmi->bsize];

        if (mbmi->ref_frame[0] == ref_frame &&
            mbmi->ref_frame[1] == NONE_FRAME) {
          record_samples(mbmi, pts, pts_inref, i, 1, 0, -1);
          pts += 2;
          pts_inref += 2;
          if (++np >= LEAST_SQUARES_SAMPLES_MAX)
            return LEAST_SQUARES_SAMPLES_MAX;
        }
      }
    }
  }
  assert(np <= LEAST_SQUARES_SAMPLES_MAX);

  // Top-left block
  if (do_tl && left_available && up_available) {
    const int mi_row_offset = -1;
    const int mi_col_offset = -1;
    MB_MODE_INFO *mbmi = xd->mi[mi_col_offset + mi_row_offset * mi_stride];

    if (mbmi->ref_frame[0] == ref_frame && mbmi->ref_frame[1] == NONE_FRAME) {
      record_samples(mbmi, pts, pts_inref, 0, -1, 0, -1);
      pts += 2;
      pts_inref += 2;
      if (++np >= LEAST_SQUARES_SAMPLES_MAX) return LEAST_SQUARES_SAMPLES_MAX;
    }
  }
  assert(np <= LEAST_SQUARES_SAMPLES_MAX);

  // Top-right block
  if (do_tr &&
      has_top_right(cm, xd, mi_row, mi_col, AOMMAX(xd->width, xd->height))) {
    const POSITION trb_pos = { -1, xd->width };
    const TileInfo *const tile = &xd->tile;
    if (is_inside(tile, mi_col, mi_row, &trb_pos)) {
      const int mi_row_offset = -1;
      const int mi_col_offset = xd->width;
      const MB_MODE_INFO *mbmi =
          xd->mi[mi_col_offset + mi_row_offset * mi_stride];

      if (mbmi->ref_frame[0] == ref_frame && mbmi->ref_frame[1] == NONE_FRAME) {
        record_samples(mbmi, pts, pts_inref, 0, -1, xd->width, 1);
        if (++np >= LEAST_SQUARES_SAMPLES_MAX) return LEAST_SQUARES_SAMPLES_MAX;
      }
    }
  }
  assert(np <= LEAST_SQUARES_SAMPLES_MAX);

  return np;
}